

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

bool __thiscall
t_ocaml_generator::struct_member_default_cheaply_comparable
          (t_ocaml_generator *this,t_field *tmember)

{
  t_const_value *ptVar1;
  int iVar2;
  t_type *ptVar3;
  
  ptVar3 = t_type::get_true_type(tmember->type_);
  ptVar1 = tmember->value_;
  if (ptVar1 != (t_const_value *)0x0) {
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
    if ((char)iVar2 != '\0') {
      if (*(int *)&ptVar3[1].super_t_doc._vptr_t_doc != 7) {
        return true;
      }
      return (bool)(-(ptVar1->doubleVal_ == 0.0) & 1);
    }
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xe])(ptVar3);
    if ((char)iVar2 != '\0') {
      return (ptVar1->listVal_).
             super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish ==
             (ptVar1->listVal_).
             super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
             super__Vector_impl_data._M_start;
    }
  }
  return false;
}

Assistant:

bool t_ocaml_generator::struct_member_default_cheaply_comparable(t_field* tmember) {
  t_type* type = get_true_type(tmember->get_type());
  t_const_value* val = tmember->get_value();
  if (!val) {
    return false;
  } else if (type->is_base_type()) {
    // Base types are generally cheaply compared for structural equivalence.
    switch (((t_base_type*)type)->get_base()) {
    case t_base_type::TYPE_DOUBLE:
      if (val->get_double() == 0.0)
        return true;
      else
        return false;
    default:
      return true;
    }
  } else if (type->is_list()) {
    // Empty lists are cheaply compared for structural equivalence.
    // Is empty list?
    if (val->get_list().size() == 0)
      return true;
    else
      return false;
  } else {
    return false;
  }
}